

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::IndexPropertyDescriptorMap::TryGetLastIndex(IndexPropertyDescriptorMap *this,uint32 *lastIndex)

{
  uint32 key;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  pBVar1 = (this->indexPropertyMap).ptr;
  if (pBVar1->count != pBVar1->freeCount) {
    EnsureIndexList(this);
    pBVar1 = (this->indexPropertyMap).ptr;
    uVar5 = pBVar1->freeCount;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar5 = ~uVar5 + pBVar1->count; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
      key = (this->indexList).ptr[uVar5];
      bVar3 = TryGetReference(this,key,&local_38);
      if (!bVar3 || local_38 == (IndexPropertyDescriptor *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x59,"(b && descriptor)","b && descriptor");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if ((local_38->Attributes & 8) == 0) {
        *lastIndex = key;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IndexPropertyDescriptorMap::TryGetLastIndex(uint32* lastIndex)
    {
        if (Count() == 0)
        {
            return false;
        }

        EnsureIndexList();

        // Search the index list backwards for the last index
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (!(descriptor->Attributes & PropertyDeleted))
            {
                *lastIndex = key;
                return true;
            }
        }

        return false;
    }